

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::Iterator
          (Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_> *this,
          View<unsigned_char,_false,_std::allocator<unsigned_long>_> *view,size_t index)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  View<unsigned_char,_true,_std::allocator<unsigned_long>_> *this_01;
  reference puVar1;
  size_t sVar2;
  size_t sVar3;
  runtime_error *prVar4;
  ulong uVar5;
  size_t sVar6;
  allocator_type local_2d;
  int local_2c;
  
  this->view_ = (view_pointer)view;
  this->pointer_ = (pointer)0x0;
  this->index_ = index;
  if (view->data_ == (pointer)0x0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Assertion failed.");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = &this->coordinates_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,(view->geometry_).dimension_,&local_2d);
  if ((view->geometry_).size_ == 0) {
    if (index != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Assertion failed.");
LAB_00106923:
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(view);
    uVar5 = (view->geometry_).size_;
    if ((view->geometry_).isSimple_ == true) {
      if (uVar5 < index) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Assertion failed.");
        goto LAB_00106923;
      }
      local_2c = 0;
      puVar1 = marray_detail::AccessOperatorHelper<true>::
               execute<unsigned_char,int,false,std::allocator<unsigned_long>>(view,&local_2c);
      puVar1 = puVar1 + index;
    }
    else if (index < uVar5) {
      View<unsigned_char,false,std::allocator<unsigned_long>>::
      indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((View<unsigned_char,false,std::allocator<unsigned_long>> *)view,index,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start);
      puVar1 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()(view,index);
    }
    else {
      this_01 = this->view_;
      View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant(this_01);
      if ((this_01->geometry_).coordinateOrder_ == LastMajorOrder) {
        sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(view,0);
        *(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
         super__Vector_impl_data._M_start = sVar2;
        if (view->data_ != (pointer)0x0) {
          uVar5 = 1;
          do {
            if ((view->geometry_).dimension_ <= uVar5) goto LAB_001068a9;
            sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(view,uVar5);
            (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar5] = sVar2 - 1;
            uVar5 = uVar5 + 1;
          } while (view->data_ != (pointer)0x0);
        }
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Assertion failed.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (this->view_->data_ == (pointer)0x0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Assertion failed.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      sVar6 = (this->view_->geometry_).dimension_;
      sVar2 = sVar6 - 1;
      sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(view,sVar2);
      (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[sVar6 - 1] = sVar3;
      if (sVar2 != 0) {
        sVar6 = 0;
        do {
          sVar3 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(view,sVar6);
          (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar6] = sVar3 - 1;
          sVar6 = sVar6 + 1;
        } while (sVar2 != sVar6);
      }
LAB_001068a9:
      puVar1 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                         (view,(view->geometry_).size_ - 1);
      puVar1 = puVar1 + 1;
    }
    this->pointer_ = puVar1;
  }
  testInvariant(this);
  return;
}

Assistant:

inline Iterator<T, isConst, A>::Iterator
(
    const View<T, false, A>& view,
    const std::size_t index
)
:   view_(reinterpret_cast<view_pointer>(&view)),
    pointer_(0),
    index_(index),
    coordinates_(std::vector<std::size_t>(view.dimension()))
    // Note for developers: If isConst==true, the construction
    // view_(reinterpret_cast<view_pointer>(&view)) works as well.
    // This is intended because it should be possible to construct 
    // a constant iterator on mutable data.
{
    if(view.size() == 0) { // un-initialized view
        marray_detail::Assert(MARRAY_NO_ARG_TEST || index == 0);
    }
    else {
        if(view.isSimple()) {
            marray_detail::Assert(MARRAY_NO_ARG_TEST || index <= view.size());
            pointer_ = &view(0) + index;
        }
        else {
            if(index >= view.size()) { // end iterator
                if(view_->coordinateOrder() == LastMajorOrder) {
                    coordinates_[0] = view.shape(0);
                    for(std::size_t j=1; j<view.dimension(); ++j) {
                        coordinates_[j] = view.shape(j)-1;
                    }
                }
                else { // FirstMajorOrder
                    std::size_t d = view_->dimension() - 1;
                    coordinates_[d] = view.shape(d);
                    for(std::size_t j=0; j<d; ++j) {
                        coordinates_[j] = view.shape(j)-1;
                    }
                }
                pointer_ = &view(view.size()-1) + 1;
            }
            else {
                view.indexToCoordinates(index, coordinates_.begin());
                pointer_ = &view(index);
            }
        }
    }
    testInvariant();
}